

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::BamReaderPrivate::LoadReferenceData(BamReaderPrivate *this)

{
  BgzfStream *this_00;
  char *data;
  char *__end;
  uint uVar1;
  ulong __n;
  uint uVar2;
  char buffer [4];
  RefData aReference;
  uint local_90;
  allocator local_89;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  BamReaderPrivate *local_68;
  value_type local_60;
  RefVector *local_38;
  
  this_00 = &this->m_stream;
  BgzfStream::Read(this_00,(char *)&local_90,4);
  uVar2 = local_90 >> 0x18 | (local_90 & 0xff0000) >> 8 | (local_90 & 0xff00) << 8 |
          local_90 << 0x18;
  if (this->m_isBigEndian == false) {
    uVar2 = local_90;
  }
  local_38 = &this->m_references;
  local_68 = this;
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::reserve
            (local_38,(long)(int)uVar2);
  if (uVar2 != 0) {
    do {
      BgzfStream::Read(this_00,(char *)&local_90,4);
      uVar1 = local_90 >> 0x18 | (local_90 & 0xff0000) >> 8 | (local_90 & 0xff00) << 8 |
              local_90 << 0x18;
      if (local_68->m_isBigEndian == false) {
        uVar1 = local_90;
      }
      __n = (ulong)uVar1;
      data = (char *)operator_new__(__n);
      memset(data,0,__n);
      BgzfStream::Read(this_00,data,__n);
      BgzfStream::Read(this_00,(char *)&local_90,4);
      uVar1 = local_90;
      if (local_68->m_isBigEndian == true) {
        uVar1 = local_90 << 0x18 | (int)local_90 >> 0x18 | (local_90 & 0xff00) << 8 |
                local_90 >> 8 & 0xff00;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
      local_60.RefName._M_dataplus._M_p = (pointer)&local_60.RefName.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_88,local_88 + local_80);
      local_60.RefLength = 0;
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      std::__cxx11::string::string((string *)&local_88,data,&local_89);
      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_88);
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      local_60.RefLength = uVar1;
      std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::push_back
                (local_38,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.RefName._M_dataplus._M_p != &local_60.RefName.field_2) {
        operator_delete(local_60.RefName._M_dataplus._M_p);
      }
      operator_delete__(data);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return true;
}

Assistant:

bool BamReaderPrivate::LoadReferenceData(void) {

    // get number of reference sequences
    char buffer[sizeof(uint32_t)];
    m_stream.Read(buffer, sizeof(uint32_t));
    uint32_t numberRefSeqs = BamTools::UnpackUnsignedInt(buffer);
    if ( m_isBigEndian ) BamTools::SwapEndian_32(numberRefSeqs);
    m_references.reserve((int)numberRefSeqs);

    // iterate over all references in header
    for ( unsigned int i = 0; i != numberRefSeqs; ++i ) {

        // get length of reference name
        m_stream.Read(buffer, sizeof(uint32_t));
        uint32_t refNameLength = BamTools::UnpackUnsignedInt(buffer);
        if ( m_isBigEndian ) BamTools::SwapEndian_32(refNameLength);
        RaiiBuffer refName(refNameLength);

        // get reference name and reference sequence length
        m_stream.Read(refName.Buffer, refNameLength);
        m_stream.Read(buffer, sizeof(int32_t));
        int32_t refLength = BamTools::UnpackSignedInt(buffer);
        if ( m_isBigEndian ) BamTools::SwapEndian_32(refLength);

        // store data for reference
        RefData aReference;
        aReference.RefName   = (string)((const char*)refName.Buffer);
        aReference.RefLength = refLength;
        m_references.push_back(aReference);
    }

    // return success
    return true;
}